

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cpp
# Opt level: O3

bool __thiscall Tokenizer::tryToGetNumber(Tokenizer *this)

{
  Mark MVar1;
  char *__nptr;
  char cVar2;
  int iVar3;
  Mark *pMVar4;
  int *piVar5;
  runtime_error *this_00;
  undefined8 uVar6;
  uint uVar7;
  stringstream ss;
  undefined1 local_241;
  double local_240;
  string local_238;
  byte local_210;
  Mark local_208;
  variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
  *local_200 [5];
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  pMVar4 = Stream::getMark(&this->stream_);
  MVar1 = *pMVar4;
  cVar2 = Stream::peek(&this->stream_);
  uVar7 = (int)cVar2 - 0x30;
  if (9 < uVar7) goto LAB_0013599b;
  cVar2 = Stream::peek(&this->stream_);
  if (cVar2 == '0') {
    cVar2 = Stream::peek(&this->stream_);
    local_238._M_dataplus._M_p._0_4_ = CONCAT31(local_238._M_dataplus._M_p._1_3_,cVar2);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)&local_238,1);
    Stream::advance(&this->stream_);
  }
  else {
    while (cVar2 = Stream::peek(&this->stream_), (int)cVar2 - 0x30U < 10) {
      cVar2 = Stream::peek(&this->stream_);
      local_238._M_dataplus._M_p._0_4_ = CONCAT31(local_238._M_dataplus._M_p._1_3_,cVar2);
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)&local_238,1);
      Stream::advance(&this->stream_);
    }
  }
  cVar2 = Stream::peek(&this->stream_);
  if (cVar2 == '.') {
    cVar2 = Stream::peek(&this->stream_);
    local_238._M_dataplus._M_p._0_4_ = CONCAT31(local_238._M_dataplus._M_p._1_3_,cVar2);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)&local_238,1);
    Stream::advance(&this->stream_);
    while( true ) {
      cVar2 = Stream::peek(&this->stream_);
      if (9 < (int)cVar2 - 0x30U) break;
      cVar2 = Stream::peek(&this->stream_);
      local_238._M_dataplus._M_p._0_4_ = CONCAT31(local_238._M_dataplus._M_p._1_3_,cVar2);
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)&local_238,1);
      Stream::advance(&this->stream_);
    }
  }
  else {
    cVar2 = Stream::peek(&this->stream_);
    if ((int)cVar2 - 0x30U < 10) {
LAB_001359d6:
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1d8,"Unexpected character!","");
      makeErrorMessage(&local_238,this,&local_1d8);
      std::runtime_error::runtime_error(this_00,(string *)&local_238);
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    cVar2 = Stream::peek(&this->stream_);
    iVar3 = isalpha((int)cVar2);
    if (iVar3 != 0) goto LAB_001359d6;
  }
  std::__cxx11::stringbuf::str();
  __nptr = (char *)CONCAT44(local_238._M_dataplus._M_p._4_4_,local_238._M_dataplus._M_p._0_4_);
  piVar5 = __errno_location();
  local_240 = (double)CONCAT44(local_240._4_4_,*piVar5);
  *piVar5 = 0;
  local_238._M_string_length = (size_type)strtod(__nptr,(char **)local_200);
  if (local_200[0] ==
      (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
       *)__nptr) {
    uVar6 = std::__throw_invalid_argument("stod");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_238._M_dataplus._M_p._4_4_,local_238._M_dataplus._M_p._0_4_) !=
        &local_238.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_238._M_dataplus._M_p._4_4_,local_238._M_dataplus._M_p._0_4_),
                      local_238.field_2._M_allocated_capacity + 1);
    }
    if (local_1d8._M_dataplus._M_p != __nptr) {
      operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
    }
    if ((char)uVar7 != '\0') {
      __cxa_free_exception(piVar5);
    }
    std::__cxx11::stringstream::~stringstream(local_1b8);
    std::ios_base::~ios_base(local_138);
    _Unwind_Resume(uVar6);
  }
  if (*piVar5 == 0) {
LAB_00135915:
    *piVar5 = local_240._0_4_;
  }
  else if (*piVar5 == 0x22) {
    local_238._M_string_length = std::__throw_out_of_range("stod");
    goto LAB_00135915;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_238._M_dataplus._M_p._4_4_,local_238._M_dataplus._M_p._0_4_) !=
      &local_238.field_2) {
    local_240 = (double)local_238._M_string_length;
    operator_delete((undefined1 *)
                    CONCAT44(local_238._M_dataplus._M_p._4_4_,local_238._M_dataplus._M_p._0_4_),
                    local_238.field_2._M_allocated_capacity + 1);
    local_238._M_string_length = (size_type)local_240;
  }
  local_238._M_dataplus._M_p._0_4_ = 9;
  local_210 = 1;
  (this->token_).type = Number;
  local_200[0] = &(this->token_).value;
  local_208 = MVar1;
  std::operator=(local_200,&local_238._M_string_length,&local_241);
  (this->token_).mark = local_208;
  (*std::__detail::__variant::
    __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_&>
    ::_S_vtable._M_arr[local_210]._M_data)
            ((anon_class_1_0_00000001 *)local_200,
             (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
              *)&local_238._M_string_length);
LAB_0013599b:
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return uVar7 < 10;
}

Assistant:

bool Tokenizer::tryToGetNumber()
{
  std::stringstream ss;
  const Mark mark = stream_.getMark();
  if(isdigit(stream_.peek()))
  {
    if(stream_.peek() != '0')
    {
      while(isdigit(stream_.peek()))
      {
        ss << stream_.peek();
        stream_.advance();
      }
    }
    else
    {
      ss << stream_.peek();
      stream_.advance();
    }

    if(stream_.peek() == '.')
    {
      ss << stream_.peek();
      stream_.advance();
      while(isdigit(stream_.peek()))
      {
        ss << stream_.peek();
        stream_.advance();
      }
    }
    else if(isdigit(stream_.peek()) || isalpha(stream_.peek()))
      throw std::runtime_error(makeErrorMessage("Unexpected character!"));
  }
  else
    return false;

  try
  {
    const double value = std::stod(ss.str());
    token_ = Token(TokenType::Number, value, mark);
  }
  catch(...)
  {
    throw std::runtime_error(makeErrorMessage("Failed to parse numeric constant!"));
  }
  return true;
}